

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress_internal.h
# Opt level: O0

void ZSTD_storeSeq(seqStore_t *seqStorePtr,size_t litLength,void *literals,U32 offsetCode,
                  size_t mlBase)

{
  int in_ECX;
  ulong in_RSI;
  long *in_RDI;
  ulong in_R8;
  
  ZSTD_wildcopy((void *)mlBase,in_RDI,in_RSI);
  in_RDI[3] = in_RSI + in_RDI[3];
  if (0xffff < in_RSI) {
    *(undefined4 *)(in_RDI + 7) = 1;
    *(int *)((long)in_RDI + 0x3c) = (int)(in_RDI[1] - *in_RDI >> 3);
  }
  *(short *)(in_RDI[1] + 4) = (short)in_RSI;
  *(int *)in_RDI[1] = in_ECX + 1;
  if (0xffff < in_R8) {
    *(undefined4 *)(in_RDI + 7) = 2;
    *(int *)((long)in_RDI + 0x3c) = (int)(in_RDI[1] - *in_RDI >> 3);
  }
  *(short *)(in_RDI[1] + 6) = (short)in_R8;
  in_RDI[1] = in_RDI[1] + 8;
  return;
}

Assistant:

MEM_STATIC void ZSTD_storeSeq(seqStore_t* seqStorePtr, size_t litLength, const void* literals, U32 offsetCode, size_t mlBase)
{
#if defined(ZSTD_DEBUG) && (ZSTD_DEBUG >= 6)
    static const BYTE* g_start = NULL;
    if (g_start==NULL) g_start = (const BYTE*)literals;  /* note : index only works for compression within a single segment */
    {   U32 const pos = (U32)((const BYTE*)literals - g_start);
        DEBUGLOG(6, "Cpos%7u :%3u literals, match%3u bytes at dist.code%7u",
               pos, (U32)litLength, (U32)mlBase+MINMATCH, (U32)offsetCode);
    }
#endif
    /* copy Literals */
    assert(seqStorePtr->lit + litLength <= seqStorePtr->litStart + 128 KB);
    ZSTD_wildcopy(seqStorePtr->lit, literals, litLength);
    seqStorePtr->lit += litLength;

    /* literal Length */
    if (litLength>0xFFFF) {
        assert(seqStorePtr->longLengthID == 0); /* there can only be a single long length */
        seqStorePtr->longLengthID = 1;
        seqStorePtr->longLengthPos = (U32)(seqStorePtr->sequences - seqStorePtr->sequencesStart);
    }
    seqStorePtr->sequences[0].litLength = (U16)litLength;

    /* match offset */
    seqStorePtr->sequences[0].offset = offsetCode + 1;

    /* match Length */
    if (mlBase>0xFFFF) {
        assert(seqStorePtr->longLengthID == 0); /* there can only be a single long length */
        seqStorePtr->longLengthID = 2;
        seqStorePtr->longLengthPos = (U32)(seqStorePtr->sequences - seqStorePtr->sequencesStart);
    }
    seqStorePtr->sequences[0].matchLength = (U16)mlBase;

    seqStorePtr->sequences++;
}